

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O3

jpc_dec_cp_t * jpc_dec_cp_create(uint_fast16_t numcomps)

{
  int iVar1;
  jpc_dec_cp_t *cp;
  jpc_dec_ccp_t *pjVar2;
  jpc_pchglist_t *pjVar3;
  
  cp = (jpc_dec_cp_t *)jas_malloc(0x30);
  if (cp != (jpc_dec_cp_t *)0x0) {
    cp->flags = 0;
    cp->numcomps = (int)numcomps;
    cp->prgord = '\0';
    cp->numlyrs = 0;
    cp->mctid = '\0';
    cp->csty = '\0';
    pjVar2 = (jpc_dec_ccp_t *)jas_alloc2((long)(int)numcomps,0x380);
    cp->ccps = pjVar2;
    if (pjVar2 != (jpc_dec_ccp_t *)0x0) {
      pjVar3 = jpc_pchglist_create();
      cp->pchglist = pjVar3;
      if (pjVar3 != (jpc_pchglist_t *)0x0) {
        iVar1 = cp->numcomps;
        if (iVar1 < 1) {
          return cp;
        }
        pjVar2 = cp->ccps;
        do {
          pjVar2->flags = 0;
          pjVar2->numstepsizes = 0;
          pjVar2->numguardbits = '\0';
          pjVar2->roishift = '\0';
          pjVar2->cblkctx = '\0';
          pjVar2->numrlvls = '\0';
          pjVar2->cblkwidthexpn = '\0';
          pjVar2->cblkheightexpn = '\0';
          pjVar2->qmfbid = '\0';
          pjVar2 = pjVar2 + 1;
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
        return cp;
      }
    }
    jpc_dec_cp_destroy(cp);
  }
  return (jpc_dec_cp_t *)0x0;
}

Assistant:

static jpc_dec_cp_t *jpc_dec_cp_create(uint_fast16_t numcomps)
{
	jpc_dec_cp_t *cp;
	jpc_dec_ccp_t *ccp;
	int compno;

	if (!(cp = jas_malloc(sizeof(jpc_dec_cp_t)))) {
		return 0;
	}
	cp->flags = 0;
	cp->numcomps = numcomps;
	cp->prgord = 0;
	cp->numlyrs = 0;
	cp->mctid = 0;
	cp->csty = 0;
	if (!(cp->ccps = jas_alloc2(cp->numcomps, sizeof(jpc_dec_ccp_t)))) {
		goto error;
	}
	if (!(cp->pchglist = jpc_pchglist_create())) {
		goto error;
	}
	for (compno = 0, ccp = cp->ccps; compno < cp->numcomps;
	  ++compno, ++ccp) {
		ccp->flags = 0;
		ccp->numrlvls = 0;
		ccp->cblkwidthexpn = 0;
		ccp->cblkheightexpn = 0;
		ccp->qmfbid = 0;
		ccp->numstepsizes = 0;
		ccp->numguardbits = 0;
		ccp->roishift = 0;
		ccp->cblkctx = 0;
	}
	return cp;
error:
	if (cp) {
		jpc_dec_cp_destroy(cp);
	}
	return 0;
}